

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void delpostest(int i)

{
  void *e;
  long lVar1;
  void *pvVar2;
  long lVar3;
  
  e = array[i];
  lVar3 = (long)arraylen;
  arraylen = arraylen + -1;
  if (i < arraylen) {
    lVar1 = (long)i + 1;
    do {
      array[lVar1 + -1] = array[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar3 != lVar1);
  }
  if (tree->cmp == (cmpfn234)0x0) {
    pvVar2 = delpos234(tree,i);
  }
  else {
    pvVar2 = del234(tree,e);
  }
  if (pvVar2 != e) {
    error("del returned %p, expected %p",pvVar2,e);
  }
  verify();
  return;
}

Assistant:

void delpostest(int i)
{
    int index = i;
    void *elem = array[i], *ret;

    /* i points to the right element */
    while (i < arraylen - 1) {
        array[i] = array[i + 1];
        i++;
    }
    arraylen--;                        /* delete elem from array */

    if (tree->cmp)
        ret = del234(tree, elem);
    else
        ret = delpos234(tree, index);

    if (ret != elem) {
        error("del returned %p, expected %p", ret, elem);
    }

    verify();
}